

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.cc
# Opt level: O0

void __thiscall BuildStatus::BuildFinished(BuildStatus *this)

{
  allocator<char> local_31;
  string local_30;
  BuildStatus *local_10;
  BuildStatus *this_local;
  
  local_10 = this;
  LinePrinter::SetConsoleLocked(&this->printer_,false);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"",&local_31);
  LinePrinter::PrintOnNewLine(&this->printer_,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  return;
}

Assistant:

void BuildStatus::BuildFinished() {
  printer_.SetConsoleLocked(false);
  printer_.PrintOnNewLine("");
}